

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

long ConnectionKillOne(SessionHandle *data)

{
  conncache *pcVar1;
  connectdata *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  timeval newer;
  
  newer = curlx_tvnow();
  lVar4 = -1;
  lVar6 = lVar4;
  for (lVar5 = 0;
      (pcVar1 = (data->state).connc, pcVar1 != (conncache *)0x0 && (lVar5 < pcVar1->num));
      lVar5 = lVar5 + 1) {
    pcVar2 = pcVar1->connects[lVar5];
    if ((pcVar2 != (connectdata *)0x0) &&
       ((pcVar2->inuse == false && (lVar3 = curlx_tvdiff(newer,pcVar2->now), lVar4 < lVar3)))) {
      lVar4 = lVar3;
      lVar6 = lVar5;
    }
  }
  if (-1 < lVar6) {
    pcVar2 = pcVar1->connects[lVar6];
    pcVar2->data = data;
    Curl_disconnect(pcVar2,false);
    ((data->state).connc)->connects[lVar6] = (connectdata *)0x0;
  }
  return lVar6;
}

Assistant:

static long
ConnectionKillOne(struct SessionHandle *data)
{
  long i;
  struct connectdata *conn;
  long highscore=-1;
  long connindex=-1;
  long score;
  struct timeval now;

  now = Curl_tvnow();

  for(i=0; data->state.connc && (i< data->state.connc->num); i++) {
    conn = data->state.connc->connects[i];

    if(!conn || conn->inuse)
      continue;

    /* Set higher score for the age passed since the connection was used */
    score = Curl_tvdiff(now, conn->now);

    if(score > highscore) {
      highscore = score;
      connindex = i;
    }
  }
  if(connindex >= 0) {
    /* Set the connection's owner correctly */
    conn = data->state.connc->connects[connindex];
    conn->data = data;

    /* the winner gets the honour of being disconnected */
    (void)Curl_disconnect(conn, /* dead_connection */ FALSE);

    /* clean the array entry */
    data->state.connc->connects[connindex] = NULL;
  }

  return connindex; /* return the available index or -1 */
}